

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint llvm::dwarf::LanguageVersion(SourceLanguage Lang)

{
  uint uVar1;
  
  uVar1 = 0;
  if (Lang - DW_LANG_C89 < 0x25) {
    uVar1 = *(uint *)(&DAT_00e516d0 + (ulong)(Lang - DW_LANG_C89) * 4);
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::LanguageVersion(dwarf::SourceLanguage Lang) {
  switch (Lang) {
  default:
    return 0;
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  case DW_LANG_##NAME:                                                         \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}